

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepScanLineInputFile::setFrameBuffer
          (DeepScanLineInputFile *this,DeepFrameBuffer *frameBuffer)

{
  PixelType tifl;
  PixelType PVar1;
  size_t xpst;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  Slice *pSVar7;
  ArgExc *pAVar8;
  char *pcVar9;
  char *pcVar10;
  InSliceInfo *pIVar11;
  DeepSlice *pDVar12;
  Channel *pCVar13;
  long lVar14;
  bool *pbVar15;
  size_type sVar16;
  reference pvVar17;
  reference ppIVar18;
  DeepFrameBuffer *in_RSI;
  long in_RDI;
  size_t i_4;
  size_t i_3;
  long i_2;
  bool fill;
  ConstIterator j_1;
  ConstIterator i;
  vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  slices;
  Slice *sampleCountSlice;
  stringstream _iex_throw_s;
  ConstIterator i_1;
  ConstIterator j;
  ChannelList *channels;
  lock_guard<std::mutex> lock;
  DeepFrameBuffer *in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  uint in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  *in_stack_fffffffffffffbb8;
  DeepSlice *in_stack_fffffffffffffbc0;
  PixelType local_40c;
  char *in_stack_fffffffffffffc20;
  ChannelList *in_stack_fffffffffffffc28;
  ulong local_270;
  ulong local_268;
  long local_260;
  stringstream local_1f0 [16];
  ostream local_1e0 [376];
  const_iterator local_68;
  const_iterator local_60;
  const_iterator local_58;
  const_iterator local_50;
  ChannelList *local_38;
  DeepFrameBuffer *local_28;
  
  local_28 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)
             ,(mutex_type *)in_stack_fffffffffffffb18);
  local_38 = Header::channels((Header *)0x197938);
  local_50._M_node = (_Base_ptr)DeepFrameBuffer::begin(in_stack_fffffffffffffb18);
  do {
    local_58._M_node = (_Base_ptr)DeepFrameBuffer::end(in_stack_fffffffffffffb18);
    bVar3 = Imf_3_2::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                (ConstIterator *)in_stack_fffffffffffffb18);
    if (!bVar3) {
      pSVar7 = DeepFrameBuffer::getSampleCountSlice(local_28);
      if (pSVar7->base == (char *)0x0) {
        pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc
                  (pAVar8,"Invalid base pointer, please set a proper sample count slice.");
        __cxa_throw(pAVar8,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      *(char **)(*(long *)(in_RDI + 8) + 0x1c0) = pSVar7->base;
      *(int *)(*(long *)(in_RDI + 8) + 0x1c8) = (int)pSVar7->xStride;
      *(int *)(*(long *)(in_RDI + 8) + 0x1cc) = (int)pSVar7->yStride;
      std::
      vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
      ::vector((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                *)0x197db8);
      ChannelList::begin((ChannelList *)in_stack_fffffffffffffb18);
      DeepFrameBuffer::begin(in_stack_fffffffffffffb18);
      while( true ) {
        DeepFrameBuffer::end(in_stack_fffffffffffffb18);
        bVar3 = Imf_3_2::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                    (ConstIterator *)in_stack_fffffffffffffb18);
        if (!bVar3) break;
        while( true ) {
          ChannelList::end((ChannelList *)in_stack_fffffffffffffb18);
          bVar4 = Imf_3_2::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                      (ConstIterator *)in_stack_fffffffffffffb18);
          bVar3 = false;
          if (bVar4) {
            pcVar9 = ChannelList::ConstIterator::name((ConstIterator *)0x197ec6);
            pcVar10 = DeepFrameBuffer::ConstIterator::name((ConstIterator *)0x197edd);
            iVar5 = strcmp(pcVar9,pcVar10);
            bVar3 = iVar5 < 0;
          }
          if (!bVar3) break;
          pIVar11 = (InSliceInfo *)operator_new(0x48);
          pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0x197f3a);
          PVar1 = pCVar13->type;
          pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0x197f62);
          tifl = pCVar13->type;
          pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0x197f8a);
          in_stack_fffffffffffffb20 = pCVar13->xSampling;
          pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0x197fb3);
          in_stack_fffffffffffffb18 = (DeepFrameBuffer *)0x0;
          anon_unknown_0::InSliceInfo::InSliceInfo
                    (pIVar11,PVar1,(char *)0x0,tifl,0,0,0,in_stack_fffffffffffffb20,
                     pCVar13->ySampling,false,true,0.0);
          std::
          vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
          ::push_back((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                       *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                      (value_type *)in_stack_fffffffffffffb18);
          ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20))
          ;
        }
        ChannelList::end((ChannelList *)in_stack_fffffffffffffb18);
        bVar4 = Imf_3_2::operator==((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                    (ConstIterator *)in_stack_fffffffffffffb18);
        bVar3 = true;
        if (!bVar4) {
          pcVar9 = ChannelList::ConstIterator::name((ConstIterator *)0x19810a);
          pcVar10 = DeepFrameBuffer::ConstIterator::name((ConstIterator *)0x198121);
          iVar5 = strcmp(pcVar9,pcVar10);
          bVar3 = 0 < iVar5;
        }
        pIVar11 = (InSliceInfo *)operator_new(0x48);
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x198183);
        PVar1 = (pDVar12->super_Slice).type;
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1981ab);
        pcVar9 = (pDVar12->super_Slice).base;
        if (bVar3) {
          pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1981e0);
          local_40c = (pDVar12->super_Slice).type;
        }
        else {
          pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0x19820a);
          local_40c = pCVar13->type;
        }
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x198240);
        xpst = (pDVar12->super_Slice).xStride;
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x19826b);
        in_stack_fffffffffffffbb8 =
             (vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
              *)(pDVar12->super_Slice).yStride;
        in_stack_fffffffffffffbc0 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x198296)
        ;
        in_stack_fffffffffffffb18 =
             (DeepFrameBuffer *)(long)*(int *)&(in_stack_fffffffffffffbc0->super_Slice).field_0x34;
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1982c1);
        in_stack_fffffffffffffb20 = (pDVar12->super_Slice).xSampling;
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1982ea);
        iVar5 = (pDVar12->super_Slice).ySampling;
        pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x19831b);
        in_stack_fffffffffffffb30 = (uint)bVar3;
        anon_unknown_0::InSliceInfo::InSliceInfo
                  (pIVar11,PVar1,pcVar9,local_40c,xpst,(size_t)in_stack_fffffffffffffbb8,
                   (size_t)in_stack_fffffffffffffb18,in_stack_fffffffffffffb20,iVar5,bVar3,false,
                   (pDVar12->super_Slice).fillValue);
        std::
        vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
        ::push_back((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                     *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                    (value_type *)in_stack_fffffffffffffb18);
        ChannelList::end((ChannelList *)in_stack_fffffffffffffb18);
        bVar4 = Imf_3_2::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                    (ConstIterator *)in_stack_fffffffffffffb18);
        bVar2 = 0;
        if (bVar4) {
          bVar2 = bVar3 ^ 1;
        }
        if (bVar2 != 0) {
          ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20))
          ;
        }
        DeepFrameBuffer::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      }
      for (local_260 = 0; lVar14 = Array<bool>::size((Array<bool> *)(*(long *)(in_RDI + 8) + 0x1b0))
          , local_260 < lVar14; local_260 = local_260 + 1) {
        pbVar15 = Array::operator_cast_to_bool_((Array *)(*(long *)(in_RDI + 8) + 0x1b0));
        pbVar15[local_260] = false;
      }
      for (local_268 = 0;
          sVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (*(long *)(in_RDI + 8) + 0x108)), local_268 < sVar16;
          local_268 = local_268 + 1) {
        pvVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (*(long *)(in_RDI + 8) + 0x108),local_268);
        *pvVar17 = 0;
      }
      DeepFrameBuffer::operator=
                ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 in_stack_fffffffffffffb18);
      for (local_270 = 0;
          sVar16 = std::
                   vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                   ::size((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                           *)(*(long *)(in_RDI + 8) + 0x138)), local_270 < sVar16;
          local_270 = local_270 + 1) {
        ppIVar18 = std::
                   vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                   ::operator[]((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                                 *)(*(long *)(in_RDI + 8) + 0x138),local_270);
        if (*ppIVar18 != (value_type)0x0) {
          operator_delete(*ppIVar18,0x48);
        }
      }
      std::
      vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
      ::operator=((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                   *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      *(undefined1 *)(*(long *)(in_RDI + 8) + 0x1d0) = 1;
      std::
      vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
      ::~vector((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                 *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x198683);
      return;
    }
    DeepFrameBuffer::ConstIterator::name((ConstIterator *)0x1979eb);
    local_60._M_node =
         (_Base_ptr)ChannelList::find(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    local_68._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_fffffffffffffb18);
    bVar3 = Imf_3_2::operator==((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                (ConstIterator *)in_stack_fffffffffffffb18);
    if (!bVar3) {
      pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0x197aa1);
      iVar5 = pCVar13->xSampling;
      pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x197aca);
      if (iVar5 != (pDVar12->super_Slice).xSampling) {
LAB_00197b40:
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1f0);
        poVar6 = std::operator<<(local_1e0,"X and/or y subsampling factors of \"");
        pcVar9 = ChannelList::ConstIterator::name((ConstIterator *)0x197b83);
        poVar6 = std::operator<<(poVar6,pcVar9);
        poVar6 = std::operator<<(poVar6,"\" channel of input file \"");
        pcVar9 = fileName((DeepScanLineInputFile *)0x197bd7);
        poVar6 = std::operator<<(poVar6,pcVar9);
        std::operator<<(poVar6,"\" are not compatible with the frame buffer\'s subsampling factors."
                       );
        pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar8,local_1f0);
        __cxa_throw(pAVar8,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      pCVar13 = ChannelList::ConstIterator::channel((ConstIterator *)0x197af5);
      iVar5 = pCVar13->ySampling;
      pDVar12 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x197b1e);
      if (iVar5 != (pDVar12->super_Slice).ySampling) goto LAB_00197b40;
    }
    DeepFrameBuffer::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  } while( true );
}

Assistant:

void
DeepScanLineInputFile::setFrameBuffer (const DeepFrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif

    //
    // Check if the new frame buffer descriptor is
    // compatible with the image file header.
    //

    const ChannelList& channels = _data->header.channels ();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin ();
         j != frameBuffer.end ();
         ++j)
    {
        ChannelList::ConstIterator i = channels.find (j.name ());

        if (i == channels.end ()) continue;

        if (i.channel ().xSampling != j.slice ().xSampling ||
            i.channel ().ySampling != j.slice ().ySampling)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << i.name ()
                    << "\" channel "
                       "of input file \""
                    << fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
    }

    //
    // Store the pixel sample count table.
    // (TODO) Support for different sampling rates?
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice ();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = static_cast<int> (sampleCountSlice.xStride);
        _data->sampleCountYStride = static_cast<int> (sampleCountSlice.yStride);
    }

    //
    // Initialize the slice table for readPixels().
    //

    vector<InSliceInfo*>       slices;
    ChannelList::ConstIterator i = channels.begin ();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin ();
         j != frameBuffer.end ();
         ++j)
    {
        while (i != channels.end () && strcmp (i.name (), j.name ()) < 0)
        {
            //
            // Channel i is present in the file but not
            // in the frame buffer; data for channel i
            // will be skipped during readPixels().
            //

            slices.push_back (new InSliceInfo (
                i.channel ().type,
                NULL,
                i.channel ().type,
                0,
                0,
                0, // sampleStride
                i.channel ().xSampling,
                i.channel ().ySampling,
                false, // fill
                true,  // skip
                0.0)); // fillValue
            ++i;
        }

        bool fill = false;

        if (i == channels.end () || strcmp (i.name (), j.name ()) > 0)
        {
            //
            // Channel i is present in the frame buffer, but not in the file.
            // In the frame buffer, slice j will be filled with a default value.
            //

            fill = true;
        }

        slices.push_back (new InSliceInfo (
            j.slice ().type,
            j.slice ().base,
            fill ? j.slice ().type : i.channel ().type,
            j.slice ().xStride,
            j.slice ().yStride,
            j.slice ().sampleStride,
            j.slice ().xSampling,
            j.slice ().ySampling,
            fill,
            false, // skip
            j.slice ().fillValue));

        if (i != channels.end () && !fill) ++i;
    }

    //
    // Client may want data to be filled in multiple arrays,
    // so we reset gotSampleCount and bytesPerLine.
    //

    for (long i = 0; i < _data->gotSampleCount.size (); i++)
        _data->gotSampleCount[i] = false;
    for (size_t i = 0; i < _data->bytesPerLine.size (); i++)
        _data->bytesPerLine[i] = 0;

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size (); i++)
        delete _data->slices[i];
    _data->slices           = slices;
    _data->frameBufferValid = true;
}